

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int MapImageFromPalette(VP8LEncoder *enc)

{
  int iVar1;
  VP8LEncoder *in_RDI;
  int xbits;
  int palette_size;
  uint32_t *palette;
  int height;
  int width;
  WebPPicture *pic;
  int in_stack_00001824;
  uint32_t *in_stack_00001828;
  uint32_t in_stack_00001834;
  uint32_t *in_stack_00001838;
  uint32_t in_stack_00001844;
  uint32_t *in_stack_00001848;
  int in_stack_00001860;
  int in_stack_00001868;
  int in_stack_00001870;
  WebPPicture *in_stack_00001878;
  uint32_t local_38;
  WebPPicture *pWVar2;
  int local_c;
  
  pWVar2 = in_RDI->pic;
  iVar1 = in_RDI->palette_size;
  if (iVar1 < 5) {
    local_38 = 2;
    if (iVar1 < 3) {
      local_38 = 3;
    }
  }
  else {
    local_38 = (uint32_t)(iVar1 < 0x11);
  }
  VP8LSubSampleSize(pWVar2->width,local_38);
  iVar1 = AllocateTransformBuffer(in_RDI,(int)((ulong)pWVar2 >> 0x20),(int)pWVar2);
  if (iVar1 == 0) {
    local_c = 0;
  }
  else {
    iVar1 = ApplyPalette(in_stack_00001848,in_stack_00001844,in_stack_00001838,in_stack_00001834,
                         in_stack_00001828,in_stack_00001824,in_stack_00001860,in_stack_00001868,
                         in_stack_00001870,in_stack_00001878);
    if (iVar1 == 0) {
      local_c = 0;
    }
    else {
      in_RDI->argb_content = kEncoderPalette;
      local_c = 1;
    }
  }
  return local_c;
}

Assistant:

static int MapImageFromPalette(VP8LEncoder* const enc) {
  const WebPPicture* const pic = enc->pic;
  const int width = pic->width;
  const int height = pic->height;
  const uint32_t* const palette = enc->palette;
  const int palette_size = enc->palette_size;
  int xbits;

  // Replace each input pixel by corresponding palette index.
  // This is done line by line.
  if (palette_size <= 4) {
    xbits = (palette_size <= 2) ? 3 : 2;
  } else {
    xbits = (palette_size <= 16) ? 1 : 0;
  }

  if (!AllocateTransformBuffer(enc, VP8LSubSampleSize(width, xbits), height)) {
    return 0;
  }
  if (!ApplyPalette(pic->argb, pic->argb_stride, enc->argb,
                    enc->current_width, palette, palette_size, width, height,
                    xbits, pic)) {
    return 0;
  }
  enc->argb_content = kEncoderPalette;
  return 1;
}